

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int luv_udp_recv_start(lua_State *L)

{
  int status;
  uv_udp_t *handle_00;
  int ret;
  uv_udp_t *handle;
  lua_State *L_local;
  
  handle_00 = luv_check_udp(L,1);
  luv_check_callback(L,(luv_handle_t *)handle_00->data,1,2);
  status = uv_udp_recv_start(handle_00,luv_alloc_cb,luv_udp_recv_cb);
  if (status < 0) {
    L_local._4_4_ = luv_error(L,status);
  }
  else {
    lua_pushinteger(L,(long)status);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_udp_recv_start(lua_State* L) {
  uv_udp_t* handle = luv_check_udp(L, 1);
  int ret;
  luv_check_callback(L, (luv_handle_t*)handle->data, LUV_RECV, 2);
  ret = uv_udp_recv_start(handle, luv_alloc_cb, luv_udp_recv_cb);
#if LUV_UV_VERSION_LEQ(1, 23, 0)
  // in Libuv <= 1.23.0, uv_udp_recv_start will return untranslated error codes on Windows
  ret = uv_translate_sys_error(ret);
#endif
  return luv_result(L, ret);
}